

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::PrototypeObject
               (Var prototypeProperty,RecyclableObject *constructorFunction,
               ScriptContext *scriptContext,RecyclableObject **prototypeObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  JavascriptLibrary *this;
  DynamicObject *pDVar6;
  TypeId prototypeType;
  RecyclableObject **prototypeObject_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *constructorFunction_local;
  Var prototypeProperty_local;
  TypeId local_18;
  TypeId typeId;
  
  if (prototypeProperty == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(prototypeProperty);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(prototypeProperty);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(prototypeProperty);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  BVar3 = IsObjectType(local_18);
  if (BVar3 == 0) {
    this = RecyclableObject::GetLibrary(constructorFunction);
    pDVar6 = JavascriptLibraryBase::GetObjectPrototype(&this->super_JavascriptLibraryBase);
    *prototypeObject = &pDVar6->super_RecyclableObject;
  }
  else {
    pRVar5 = VarTo<Js::RecyclableObject>(prototypeProperty);
    *prototypeObject = pRVar5;
  }
  prototypeProperty_local._7_1_ = BVar3 != 0;
  return prototypeProperty_local._7_1_;
}

Assistant:

bool JavascriptOperators::PrototypeObject(Var prototypeProperty, RecyclableObject * constructorFunction, ScriptContext * scriptContext, RecyclableObject** prototypeObject)
    {
        TypeId prototypeType = JavascriptOperators::GetTypeId(prototypeProperty);

        if (JavascriptOperators::IsObjectType(prototypeType))
        {
            *prototypeObject = VarTo<RecyclableObject>(prototypeProperty);
            return true;
        }
        *prototypeObject = constructorFunction->GetLibrary()->GetObjectPrototype();
        return false;
    }